

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O2

void __thiscall zmq::context_t::context_t(context_t *this,int io_threads_,int max_sockets_)

{
  void *pvVar1;
  error_t *this_00;
  
  pvVar1 = (void *)zmq_ctx_new();
  this->ptr = pvVar1;
  if (pvVar1 != (void *)0x0) {
    zmq_ctx_set(pvVar1,1,io_threads_);
    zmq_ctx_set(this->ptr,2,max_sockets_);
    return;
  }
  this_00 = (error_t *)__cxa_allocate_exception(0x10);
  error_t::error_t(this_00);
  __cxa_throw(this_00,&error_t::typeinfo,std::exception::~exception);
}

Assistant:

explicit context_t(int io_threads_,
                              int max_sockets_ = ZMQ_MAX_SOCKETS_DFLT)
    {
        ptr = zmq_ctx_new();
        if (ptr == ZMQ_NULLPTR)
            throw error_t();

        int rc = zmq_ctx_set(ptr, ZMQ_IO_THREADS, io_threads_);
        ZMQ_ASSERT(rc == 0);

        rc = zmq_ctx_set(ptr, ZMQ_MAX_SOCKETS, max_sockets_);
        ZMQ_ASSERT(rc == 0);
    }